

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

void PrintEthernetPhyStatusV3(AmpIO *Board,uint chan)

{
  ushort uVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  undefined8 *puVar7;
  uint16_t reg;
  uint16_t coreReg;
  ushort local_2c;
  ushort local_2a;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PHY",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  bVar2 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,1,0x1a,&local_2c);
  if (bVar2) {
    if ((local_2c & 4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," link-good",10);
    }
    pcVar6 = " full-duplex";
    if ((local_2c & 8) == 0) {
      pcVar6 = " half-duplex";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,0xc);
    uVar1 = local_2c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    puVar7 = (undefined8 *)&DAT_0012c4a0;
    pcVar6 = *(char **)(&DAT_0012c4a0 + (uVar1 >> 1 & 0x18));
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
    if ((local_2c & 2) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," polarity-reversed",0x12);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reading GMII core register: ",0x1c);
    bVar2 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,8,0x10,&local_2a);
    if (bVar2) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      lVar5 = 0;
      do {
        if ((local_2a & 0x2040) == *(ushort *)((long)&DAT_00120140 + lVar5)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", Speed: ",9);
          pcVar6 = (char *)*puVar7;
          sVar4 = strlen(pcVar6);
          goto LAB_0010660d;
        }
        puVar7 = puVar7 + 1;
        lVar5 = lVar5 + 2;
      } while (lVar5 != 8);
      goto LAB_00106612;
    }
    pcVar6 = " failed to read to GMII core register";
    sVar4 = 0x25;
  }
  else {
    pcVar6 = " failed to read PHYSR";
    sVar4 = 0x15;
  }
LAB_0010660d:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
LAB_00106612:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

void PrintEthernetPhyStatusV3(AmpIO &Board, unsigned int chan)
{
    std::cout << "PHY" << chan << ":";
    uint16_t reg;
    unsigned int phyAddr = FpgaIO::PHY_RTL8211F;
    // This should be on page 0xa43, but seems to work fine on default page
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYSR, reg)) {
        std::cout << " failed to read PHYSR" << std::endl;
        return;
    }
    if (reg & 0x0004) std::cout << " link-good";
    if (reg & 0x0008) std::cout << " full-duplex";
    else std::cout << " half-duplex";
    unsigned int speed = (reg & 0x0030)>>4;
    const char *speedStr[4] = { "10Mbps", "100 Mbps", "1000 Mbps", "??" };
    std::cout << " " << speedStr[speed];
    if (reg & 0x0002) std::cout << " polarity-reversed";
    std::cout << std::endl;

    // Speed setting uses bits 6 and 13, as follows:
    //
    //   speed | Mbps | 6,13  | register value
    //     0   |   10 | 0, 0  |     0x0000
    //     1   |  100 | 0, 1  |     0x2000
    //     2   | 1000 | 1, 0  |     0x0040
    //     3   |   ?? | 1, 1  |     0x2040
    unsigned short speedMap[4] = { 0x0000, 0x2000, 0x0040, 0x2040 };
    std::cout << "Reading GMII core register: ";
    uint16_t coreReg;
    if (Board.ReadRTL8211F_Register(chan, FpgaIO::PHY_GMII_CORE, 16, coreReg)) {
        std::cout << std::hex << coreReg << std::dec;
        for (size_t i = 0; i < 4; i++) {
            if ((coreReg&0x2040) == speedMap[i]) {
                std::cout << ", Speed: " << speedStr[i];
                break;
            }
        }
        std::cout << std::endl;
    }
    else {
        std::cout << " failed to read to GMII core register" << std::endl;
    }
}